

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::LSR_AB(CPU *this)

{
  uint16_t uVar1;
  byte bVar2;
  
  this->cycles = 6;
  uVar1 = GetWord(this);
  bVar2 = ReadByte(this,uVar1 & 0xff);
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (bVar2 < 2) * '\x02' | (this->field_6).ps & 0x7c | bVar2 & 1;
  WriteByte(this,uVar1 & 0xff,bVar2 >> 1);
  return;
}

Assistant:

void CPU::LSR_AB()
{
    cycles = 6;
    uint8_t addr = GetWord();
    uint8_t data = ReadByte(addr);
    C = (data & 0b00000001) > 0;
    data >>= 1;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}